

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

double ExtraCostCombined_C(uint32_t *X,uint32_t *Y,int length)

{
  int xy;
  double cost;
  int i;
  int length_local;
  uint32_t *Y_local;
  uint32_t *X_local;
  
  cost = 0.0;
  for (i = 2; i < length + -2; i = i + 1) {
    cost = (double)(int)((i >> 1) * (X[i + 2] + Y[i + 2])) + cost;
  }
  return cost;
}

Assistant:

static double ExtraCostCombined_C(const uint32_t* X, const uint32_t* Y,
                                  int length) {
  int i;
  double cost = 0.;
  for (i = 2; i < length - 2; ++i) {
    const int xy = X[i + 2] + Y[i + 2];
    cost += (i >> 1) * xy;
  }
  return cost;
}